

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O3

void __thiscall Attribute::Attribute(Attribute *this,Attribute *rhs)

{
  (this->super_DerBase).cbData = 0;
  (this->super_DerBase)._vptr_DerBase = (_func_int **)&PTR_EncodedSize_001503e8;
  (this->attrType).super_DerBase.cbData = (rhs->attrType).super_DerBase.cbData;
  (this->attrType).super_DerBase._vptr_DerBase = (_func_int **)&PTR_EncodedSize_00151908;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&(this->attrType).value,&(rhs->attrType).value);
  (this->attrType).oidIndex = (rhs->attrType).oidIndex;
  (this->attrValues).super__Vector_base<AnyType,_std::allocator<AnyType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->attrValues).super__Vector_base<AnyType,_std::allocator<AnyType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->attrValues).super__Vector_base<AnyType,_std::allocator<AnyType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<AnyType,std::allocator<AnyType>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<AnyType_const*,std::vector<AnyType,std::allocator<AnyType>>>>
            ((vector<AnyType,std::allocator<AnyType>> *)&this->attrValues,0,
             (rhs->attrValues).super__Vector_base<AnyType,_std::allocator<AnyType>_>._M_impl.
             super__Vector_impl_data._M_start,
             (rhs->attrValues).super__Vector_base<AnyType,_std::allocator<AnyType>_>._M_impl.
             super__Vector_impl_data._M_finish);
  return;
}

Assistant:

Attribute(const Attribute& rhs) : attrType(rhs.attrType)
	{
		attrValues.insert(attrValues.begin(), rhs.attrValues.begin(), rhs.attrValues.end());
	}